

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O3

void __thiscall cursespp::ShortcutsWindow::ShortcutsWindow(ShortcutsWindow *this)

{
  Window::Window(&this->super_Window,(IWindow *)0x0);
  (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ShortcutsWindow_001a72f0;
  (this->super_Window).super_IWindow.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ShortcutsWindow_001a74c8;
  (this->super_Window).super_IWindow.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ShortcutsWindow_001a74f8;
  (this->super_Window).super_IWindow.super_IMessageTarget._vptr_IMessageTarget =
       (_func_int **)&PTR__ShortcutsWindow_001a7520;
  (this->super_IKeyHandler)._vptr_IKeyHandler = (_func_int **)&PTR__ShortcutsWindow_001a7548;
  *(undefined8 *)&(this->changedCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->changedCallback).super__Function_base._M_functor + 8) = 0;
  (this->changedCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->changedCallback)._M_invoker = (_Invoker_type)0x0;
  (this->entries).
  super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries).
  super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entries).
  super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->activeKey)._M_dataplus._M_p = (pointer)&(this->activeKey).field_2;
  (this->activeKey)._M_string_length = 0;
  (this->activeKey).field_2._M_local_buf[0] = '\0';
  (this->originalKey)._M_dataplus._M_p = (pointer)&(this->originalKey).field_2;
  (this->originalKey)._M_string_length = 0;
  (this->originalKey).field_2._M_local_buf[0] = '\0';
  this->alignment = AlignCenter;
  Window::SetFrameVisible(&this->super_Window,false);
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0xc])(this);
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[9])(this);
  return;
}

Assistant:

ShortcutsWindow::ShortcutsWindow()
: Window(nullptr)
, alignment(text::AlignCenter) {
    this->SetFrameVisible(false);
    this->SetFocusedContentColor(Color::ShortcutRowFocused);
    this->SetContentColor(Color::ShortcutRowDefault);
}